

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

FFSTypeHandle_conflict FFSTypeHandle_from_encode(FFSContext c,char *buffer)

{
  FMFormat_conflict p_Var1;
  FFSTypeHandle_conflict p_Var2;
  
  p_Var1 = FMformat_from_ID(c->fmc,buffer);
  if (p_Var1 != (FMFormat_conflict)0x0) {
    p_Var2 = FFSTypeHandle_by_index(c,p_Var1->format_index);
    return p_Var2;
  }
  return (FFSTypeHandle_conflict)0x0;
}

Assistant:

extern
FFSTypeHandle
FFSTypeHandle_from_encode(FFSContext c, char *buffer) 
{
    int index;
    FFSTypeHandle handle;
    /* first element in encoded buffer is format ID */
    FMFormat fmf = FMformat_from_ID(c->fmc, buffer);
    if (fmf == NULL) return NULL;
    index = fmf->format_index;
    handle = FFSTypeHandle_by_index(c, index);
    return handle;
}